

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Callbacks::Callbacks
          (Callbacks *this,void *user_data,pfn_allocate alloc_,pfn_free free_,pfn_error error_)

{
  bool bVar1;
  error_flags eVar2;
  code *in_RCX;
  code *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  code *in_R8;
  code *local_90;
  code *local_80;
  code *local_70;
  
  *in_RDI = in_RSI;
  local_70 = in_RDX;
  if (in_RDX == (code *)0x0) {
    local_70 = allocate_impl;
  }
  in_RDI[1] = local_70;
  local_80 = in_RCX;
  if (in_RCX == (code *)0x0) {
    local_80 = free_impl;
  }
  in_RDI[2] = local_80;
  local_90 = in_R8;
  if (in_R8 == (code *)0x0) {
    local_90 = error_impl;
  }
  in_RDI[3] = local_90;
  if (in_RDI[1] == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x6112,"check failed: %s","m_allocate");
  }
  if (in_RDI[2] == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x6113,"check failed: %s","m_free");
  }
  if (in_RDI[3] == 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x34984b,(char *)0x6114,"check failed: %s","m_error");
  }
  return;
}

Assistant:

Callbacks::Callbacks(void *user_data, pfn_allocate alloc_, pfn_free free_, pfn_error error_)
    :
    m_user_data(user_data),
    #ifndef RYML_NO_DEFAULT_CALLBACKS
    m_allocate(alloc_ ? alloc_ : allocate_impl),
    m_free(free_ ? free_ : free_impl),
    m_error(error_ ? error_ : error_impl)
    #else
    m_allocate(alloc_),
    m_free(free_),
    m_error(error_)
    #endif
{
    C4_CHECK(m_allocate);
    C4_CHECK(m_free);
    C4_CHECK(m_error);
}